

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

int __thiscall helics::ActionMessage::toByteArray(ActionMessage *this,byte *data,size_t buffer_size)

{
  bool bVar1;
  int iVar2;
  BaseType BVar3;
  BaseType BVar4;
  size_t sVar5;
  baseType bVar6;
  byte *pbVar7;
  size_type sVar8;
  reference this_00;
  size_type sVar9;
  char *__src;
  ulong uVar10;
  baseType *__dest;
  ulong in_RDX;
  uint8_t *in_RSI;
  int *in_RDI;
  int actSize;
  uint32_t strsize_1;
  uint32_t strsize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  baseType baseTimeCode;
  byte *dataStart;
  uint32_t ssize;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff48;
  int *piVar11;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff50;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  int *local_48;
  baseType local_40;
  uint8_t *local_38;
  uint local_30;
  ulong local_20;
  baseType *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = (baseType *)in_RSI;
  if ((toByteArray(std::byte*,unsigned_long)::littleEndian == '\0') &&
     (iVar2 = __cxa_guard_acquire(&toByteArray(std::byte*,unsigned_long)::littleEndian), iVar2 != 0)
     ) {
    toByteArray::littleEndian = isLittleEndian();
    __cxa_guard_release(&toByteArray(std::byte*,unsigned_long)::littleEndian);
  }
  local_30 = 0;
  if (*in_RDI != 500) {
    sVar5 = SmallBuffer::size((SmallBuffer *)(in_RDI + 0x10));
    if (sVar5 < 0xffffff) {
      sVar5 = SmallBuffer::size((SmallBuffer *)(in_RDI + 0x10));
      local_30 = (uint)sVar5;
    }
    else {
      local_30 = 0xffffff;
    }
  }
  if (((local_18 == (baseType *)0x0) || (local_20 == 0)) || (local_20 < (ulong)local_30 + 0x2d)) {
    local_4 = -1;
  }
  else {
    local_38 = (uint8_t *)local_18;
    *(uint8_t *)local_18 = toByteArray::littleEndian;
    *(uint8_t *)((long)local_18 + 1) = (uint8_t)(local_30 >> 0x10);
    *(uint8_t *)((long)local_18 + 2) = (uint8_t)(local_30 >> 8);
    *(uint8_t *)((long)local_18 + 3) = (uint8_t)local_30;
    *(int *)((long)local_18 + 4) = *in_RDI;
    *(int *)((long)local_18 + 8) = in_RDI[1];
    local_18 = (baseType *)((long)local_18 + 0xc);
    BVar3 = GlobalFederateId::baseValue((GlobalFederateId *)(in_RDI + 2));
    *(BaseType *)local_18 = BVar3;
    local_18 = (baseType *)((long)local_18 + 4);
    BVar4 = InterfaceHandle::baseValue((InterfaceHandle *)(in_RDI + 3));
    *(BaseType *)local_18 = BVar4;
    local_18 = (baseType *)((long)local_18 + 4);
    BVar3 = GlobalFederateId::baseValue((GlobalFederateId *)(in_RDI + 4));
    *(BaseType *)local_18 = BVar3;
    local_18 = (baseType *)((long)local_18 + 4);
    BVar4 = InterfaceHandle::baseValue((InterfaceHandle *)(in_RDI + 5));
    *(BaseType *)local_18 = BVar4;
    *(short *)((long)local_18 + 4) = (short)in_RDI[6];
    *(undefined2 *)((long)local_18 + 6) = *(undefined2 *)((long)in_RDI + 0x1a);
    *(int *)((long)local_18 + 8) = in_RDI[7];
    local_18 = (baseType *)((long)local_18 + 0xc);
    local_40 = TimeRepresentation<count_time<9,_long>_>::getBaseTimeCode
                         ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 8));
    *local_18 = local_40;
    __dest = local_18 + 1;
    local_18 = __dest;
    if (*in_RDI == 500) {
      local_40 = TimeRepresentation<count_time<9,_long>_>::getBaseTimeCode
                           ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 10));
      *local_18 = local_40;
      local_18 = local_18 + 1;
      local_40 = TimeRepresentation<count_time<9,_long>_>::getBaseTimeCode
                           ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0xc));
      *local_18 = local_40;
      local_18 = local_18 + 1;
      bVar6 = TimeRepresentation<count_time<9,_long>_>::getBaseTimeCode
                        ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0xe));
      *local_18 = bVar6;
      *(uint8_t *)(local_18 + 1) = '\0';
      local_4 = ((int)local_18 + 9) - (int)local_38;
    }
    else {
      if (local_30 != 0) {
        pbVar7 = SmallBuffer::data((SmallBuffer *)(in_RDI + 0x10));
        memcpy(__dest,pbVar7,(ulong)local_30);
        local_18 = (baseType *)((long)local_18 + (ulong)local_30);
      }
      sVar5 = SmallBuffer::size((SmallBuffer *)(in_RDI + 0x10));
      if (sVar5 < 0xffffff) {
        sVar8 = CLI::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(in_RDI + 0x28));
        *(uint8_t *)local_18 = (uint8_t)sVar8;
      }
      else {
        sVar8 = CLI::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(in_RDI + 0x28));
        *(uint8_t *)local_18 = (char)sVar8 + '\x01';
      }
      local_18 = (baseType *)((long)local_18 + 1);
      local_30 = local_30 + 0x2d;
      local_48 = in_RDI + 0x28;
      local_50._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CLI::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(in_stack_ffffffffffffff48);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(in_stack_ffffffffffffff48);
      while (bVar1 = __gnu_cxx::
                     operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               (in_stack_ffffffffffffff50,
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffff48), ((bVar1 ^ 0xffU) & 1) != 0) {
        this_00 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_50);
        sVar9 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::size(this_00);
        iVar2 = (int)sVar9;
        if (local_20 < local_30 + iVar2 + 4) {
          return -1;
        }
        *(int *)local_18 = iVar2;
        piVar11 = (int *)((long)local_18 + 4);
        local_18 = (baseType *)piVar11;
        __src = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5d1d58
                      );
        sVar9 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::size(this_00);
        memcpy(piVar11,__src,sVar9);
        sVar9 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::size(this_00);
        local_18 = (baseType *)(sVar9 + (long)local_18);
        local_30 = iVar2 + 4 + local_30;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_50);
      }
      sVar5 = SmallBuffer::size((SmallBuffer *)(in_RDI + 0x10));
      if (0xffffff < sVar5) {
        uVar10 = (ulong)local_30;
        sVar5 = SmallBuffer::size((SmallBuffer *)(in_RDI + 0x10));
        if (local_20 < (uVar10 + sVar5) - 0xfffffb) {
          return -1;
        }
        sVar5 = SmallBuffer::size((SmallBuffer *)(in_RDI + 0x10));
        *(int *)local_18 = (int)sVar5 + -0xffffff;
        piVar11 = (int *)((long)local_18 + 4);
        local_18 = (baseType *)piVar11;
        pbVar7 = SmallBuffer::data((SmallBuffer *)(in_RDI + 0x10));
        pbVar7 = pbVar7 + 0xffffff;
        sVar5 = SmallBuffer::size((SmallBuffer *)(in_RDI + 0x10));
        memcpy(piVar11,pbVar7,sVar5 - 0xffffff);
        sVar5 = SmallBuffer::size((SmallBuffer *)(in_RDI + 0x10));
        local_18 = (baseType *)((sVar5 - 0xffffff) + (long)local_18);
      }
      local_4 = (int)local_18 - (int)local_38;
    }
  }
  return local_4;
}

Assistant:

int ActionMessage::toByteArray(std::byte* data, std::size_t buffer_size) const
{
    static const uint8_t littleEndian = isLittleEndian();

    // put the main string size in the first 4 bytes;
    std::uint32_t ssize{0UL};
    if (messageAction != CMD_TIME_REQUEST) {
        if (payload.size() >= maxPayloadSize) {
            ssize = maxPayloadSize;
        } else {
            ssize = static_cast<uint32_t>(payload.size());
        }
    }

    if ((data == nullptr) || (buffer_size == 0) || buffer_size < action_message_base_size + ssize) {
        return -1;
    }

    std::byte* dataStart = data;

    *data = static_cast<std::byte>(littleEndian);
    data[1] = static_cast<std::byte>(ssize >> 16U);
    data[2] = static_cast<std::byte>((ssize >> 8U) & 0xFFU);
    data[3] = static_cast<std::byte>(ssize & 0xFFU);
    data += sizeof(uint32_t);  // 4
    *reinterpret_cast<action_message_def::action_t*>(data) = messageAction;
    data += sizeof(action_message_def::action_t);
    *reinterpret_cast<int32_t*>(data) = messageID;
    data += sizeof(int32_t);  // 8
    *reinterpret_cast<int32_t*>(data) = source_id.baseValue();
    data += sizeof(int32_t);  // 12
    *reinterpret_cast<int32_t*>(data) = source_handle.baseValue();
    data += sizeof(int32_t);  // 16
    *reinterpret_cast<int32_t*>(data) = dest_id.baseValue();
    data += sizeof(int32_t);  // 20
    *reinterpret_cast<int32_t*>(data) = dest_handle.baseValue();
    data += sizeof(int32_t);  // 24
    *reinterpret_cast<uint16_t*>(data) = counter;
    data += sizeof(uint16_t);  // 26
    *reinterpret_cast<uint16_t*>(data) = flags;
    data += sizeof(uint16_t);  // 28
    *reinterpret_cast<int32_t*>(data) = sequenceID;
    data += sizeof(int32_t);  // 32
    auto baseTimeCode = actionTime.getBaseTimeCode();
    std::memcpy(data, &(baseTimeCode), sizeof(Time::baseType));
    data += sizeof(Time::baseType);  // 40

    if (messageAction == CMD_TIME_REQUEST) {
        baseTimeCode = Te.getBaseTimeCode();
        std::memcpy(data, &(baseTimeCode), sizeof(Time::baseType));
        data += sizeof(Time::baseType);
        baseTimeCode = Tdemin.getBaseTimeCode();
        std::memcpy(data, &(baseTimeCode), sizeof(Time::baseType));
        data += sizeof(Time::baseType);
        baseTimeCode = Tso.getBaseTimeCode();
        std::memcpy(data, &(baseTimeCode), sizeof(Time::baseType));
        data += sizeof(Time::baseType);
        *data = std::byte{0};
        ++data;
        return static_cast<int>(data - dataStart);
    }

    if (ssize > 0) {
        std::memcpy(data, payload.data(), ssize);
        data += ssize;
    }
    if (payload.size() >= maxPayloadSize) {
        *data = static_cast<std::byte>(stringData.size() + 1);
    } else {
        *data = static_cast<std::byte>(stringData.size());
    }

    ++data;
    ssize += action_message_base_size;
    for (const auto& str : stringData) {
        auto strsize = static_cast<uint32_t>(str.size());
        if (buffer_size < ssize + strsize + 4) {
            return -1;
        }

        std::memcpy(data, &strsize, sizeof(uint32_t));
        data += sizeof(uint32_t);
        std::memcpy(data, str.data(), str.size());
        data += str.size();
        ssize += strsize + 4;
    }
    if (payload.size() > maxPayloadSize) {
        if (buffer_size < ssize + payload.size() - maxPayloadSize + 4) {
            return -1;
        }
        auto strsize = static_cast<uint32_t>(payload.size() - maxPayloadSize);
        std::memcpy(data, &strsize, sizeof(uint32_t));
        data += sizeof(uint32_t);
        std::memcpy(data, payload.data() + maxPayloadSize, payload.size() - maxPayloadSize);
        data += payload.size() - maxPayloadSize;
    }
    //   }
    auto actSize = static_cast<int>(data - dataStart);
    return actSize;
}